

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  void *__ptr;
  size_t sVar4;
  char *__s1;
  ushort **ppuVar5;
  void *pvVar6;
  int in_ECX;
  int *in_RDX;
  long in_RSI;
  FILE *in_RDI;
  bool bVar7;
  char *cp;
  symbol *sp_1;
  symbol *sp;
  int len;
  char *name;
  uint hash;
  int j;
  int i;
  char *stddt;
  int maxdtlength;
  int arraysize;
  char **types;
  int lineno;
  char *local_98;
  char *local_80;
  byte *local_70;
  uint local_44;
  int local_40;
  int local_3c;
  int local_30;
  int local_20;
  
  uVar2 = *(int *)(in_RSI + 0x28) * 2;
  __ptr = calloc((long)(int)uVar2,8);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"Out of memory.\n");
    exit(1);
  }
  for (local_3c = 0; local_3c < (int)uVar2; local_3c = local_3c + 1) {
    *(undefined8 *)((long)__ptr + (long)local_3c * 8) = 0;
  }
  local_30 = 0;
  if (*(long *)(in_RSI + 0x88) != 0) {
    sVar4 = strlen(*(char **)(in_RSI + 0x88));
    local_30 = (int)sVar4;
  }
  for (local_3c = 0; local_3c < *(int *)(in_RSI + 0x28); local_3c = local_3c + 1) {
    lVar1 = *(long *)(*(long *)(in_RSI + 0x48) + (long)local_3c * 8);
    if (*(long *)(lVar1 + 0x48) != 0) {
      sVar4 = strlen(*(char **)(lVar1 + 0x48));
      if (local_30 < (int)sVar4) {
        local_30 = (int)sVar4;
      }
    }
  }
  __s1 = (char *)malloc((long)(local_30 * 2 + 1));
  if (__s1 == (char *)0x0) {
    fprintf(_stderr,"Out of memory.\n");
    exit(1);
  }
  local_3c = 0;
  do {
    if (*(int *)(in_RSI + 0x28) <= local_3c) {
      if (*(long *)(in_RSI + 0x68) == 0) {
        local_80 = "Parse";
      }
      else {
        local_80 = *(char **)(in_RSI + 0x68);
      }
      local_20 = *in_RDX;
      if (in_ECX != 0) {
        fprintf(in_RDI,"#if INTERFACE\n");
        local_20 = local_20 + 1;
      }
      if (*(long *)(in_RSI + 0x80) == 0) {
        local_98 = "void*";
      }
      else {
        local_98 = *(char **)(in_RSI + 0x80);
      }
      fprintf(in_RDI,"#define %sTOKENTYPE %s\n",local_80,local_98);
      iVar3 = local_20 + 1;
      if (in_ECX != 0) {
        fprintf(in_RDI,"#endif\n");
        iVar3 = local_20 + 2;
      }
      local_20 = iVar3;
      fprintf(in_RDI,"typedef union {\n");
      fprintf(in_RDI,"  int yyinit;\n");
      fprintf(in_RDI,"  %sTOKENTYPE yy0;\n",local_80);
      local_20 = local_20 + 3;
      for (local_3c = 0; local_3c < (int)uVar2; local_3c = local_3c + 1) {
        if (*(long *)((long)__ptr + (long)local_3c * 8) != 0) {
          fprintf(in_RDI,"  %s yy%d;\n",*(undefined8 *)((long)__ptr + (long)local_3c * 8),
                  (ulong)(local_3c + 1));
          local_20 = local_20 + 1;
          free(*(void **)((long)__ptr + (long)local_3c * 8));
        }
      }
      if ((*(long *)(in_RSI + 0x58) != 0) && (*(int *)(*(long *)(in_RSI + 0x58) + 0x34) != 0)) {
        fprintf(in_RDI,"  int yy%d;\n",(ulong)*(uint *)(*(long *)(in_RSI + 0x58) + 0x50));
        local_20 = local_20 + 1;
      }
      free(__s1);
      free(__ptr);
      fprintf(in_RDI,"} YYMINORTYPE;\n");
      *in_RDX = local_20 + 1;
      return;
    }
    lVar1 = *(long *)(*(long *)(in_RSI + 0x48) + (long)local_3c * 8);
    if (lVar1 == *(long *)(in_RSI + 0x58)) {
      *(uint *)(lVar1 + 0x50) = uVar2 + 1;
    }
    else if ((*(int *)(lVar1 + 0xc) == 1) &&
            ((*(long *)(lVar1 + 0x48) != 0 || (*(long *)(in_RSI + 0x88) != 0)))) {
      local_70 = *(byte **)(lVar1 + 0x48);
      if (local_70 == (byte *)0x0) {
        local_70 = *(byte **)(in_RSI + 0x88);
      }
      local_40 = 0;
      while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)*local_70] & 0x2000) != 0) {
        local_70 = local_70 + 1;
      }
      while (*local_70 != 0) {
        __s1[local_40] = *local_70;
        local_70 = local_70 + 1;
        local_40 = local_40 + 1;
      }
      while( true ) {
        bVar7 = false;
        if (0 < local_40) {
          ppuVar5 = __ctype_b_loc();
          bVar7 = ((*ppuVar5)[(int)(uint)(byte)__s1[local_40 + -1]] & 0x2000) != 0;
        }
        if (!bVar7) break;
        local_40 = local_40 + -1;
      }
      __s1[local_40] = '\0';
      if ((*(long *)(in_RSI + 0x80) == 0) ||
         (iVar3 = strcmp(__s1,*(char **)(in_RSI + 0x80)), iVar3 != 0)) {
        local_44 = 0;
        for (local_40 = 0; __s1[local_40] != '\0'; local_40 = local_40 + 1) {
          local_44 = local_44 * 0x35 + (int)__s1[local_40];
        }
        local_44 = (local_44 & 0x7fffffff) % uVar2;
        while (*(long *)((long)__ptr + (ulong)local_44 * 8) != 0) {
          iVar3 = strcmp(*(char **)((long)__ptr + (ulong)local_44 * 8),__s1);
          if (iVar3 == 0) {
            *(uint *)(lVar1 + 0x50) = local_44 + 1;
            break;
          }
          local_44 = local_44 + 1;
          if (uVar2 <= local_44) {
            local_44 = 0;
          }
        }
        if (*(long *)((long)__ptr + (ulong)local_44 * 8) == 0) {
          *(uint *)(lVar1 + 0x50) = local_44 + 1;
          sVar4 = strlen(__s1);
          pvVar6 = malloc((long)((int)sVar4 + 1));
          *(void **)((long)__ptr + (ulong)local_44 * 8) = pvVar6;
          if (*(long *)((long)__ptr + (ulong)local_44 * 8) == 0) {
            fprintf(_stderr,"Out of memory.\n");
            exit(1);
          }
          lemon_strcpy(*(char **)((long)__ptr + (ulong)local_44 * 8),__s1);
        }
      }
      else {
        *(undefined4 *)(lVar1 + 0x50) = 0;
      }
    }
    else {
      *(undefined4 *)(lVar1 + 0x50) = 0;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = *plineno;    /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      lemon_strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}